

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O0

int av1_get_switchable_rate
              (MACROBLOCK *x,MACROBLOCKD *xd,InterpFilter interp_filter,int dual_filter)

{
  long lVar1;
  InterpFilter IVar2;
  int iVar3;
  int in_ECX;
  char in_DL;
  long in_RSI;
  MACROBLOCKD *in_RDI;
  InterpFilter filter;
  int ctx;
  int dir;
  int inter_filter_cost;
  MB_MODE_INFO *mbmi;
  int local_30;
  int local_2c;
  int local_4;
  
  if (in_DL == '\x04') {
    lVar1 = **(long **)(in_RSI + 0x1eb8);
    local_2c = 0;
    local_30 = 0;
    while ((local_30 < 2 && ((local_30 == 0 || (in_ECX != 0))))) {
      iVar3 = av1_get_pred_context_switchable_interp(in_RDI,(int)((ulong)in_RSI >> 0x20));
      IVar2 = av1_extract_interp_filter(*(int_interpfilters *)(lVar1 + 0x14),local_30);
      local_2c = *(int *)((long)in_RDI[2].plane[2].seg_iqmatrix[1] +
                         (ulong)IVar2 * 4 + (long)iVar3 * 0xc + 0x68) + local_2c;
      local_30 = local_30 + 1;
    }
    local_4 = local_2c;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int av1_get_switchable_rate(const MACROBLOCK *x, const MACROBLOCKD *xd,
                            InterpFilter interp_filter, int dual_filter) {
  if (interp_filter == SWITCHABLE) {
    const MB_MODE_INFO *const mbmi = xd->mi[0];
    int inter_filter_cost = 0;
    for (int dir = 0; dir < 2; ++dir) {
      if (dir && !dual_filter) break;
      const int ctx = av1_get_pred_context_switchable_interp(xd, dir);
      const InterpFilter filter =
          av1_extract_interp_filter(mbmi->interp_filters, dir);
      inter_filter_cost += x->mode_costs.switchable_interp_costs[ctx][filter];
    }
    return SWITCHABLE_INTERP_RATE_FACTOR * inter_filter_cost;
  } else {
    return 0;
  }
}